

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::updateRateLimitingOrProbabilisticSampler
          (RemotelyControlledSampler *this,SamplingStrategyResponse *response)

{
  ostream *out;
  runtime_error *this_00;
  shared_ptr<jaegertracing::samplers::Sampler> sampler;
  string local_1b0 [32];
  ostringstream oss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188 [46];
  
  sampler.super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  sampler.super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((byte)response->__isset & 1) == 0) {
    if (((byte)response->__isset & 2) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      out = std::operator<<((ostream *)&oss,"Unsupported sampling strategy type ");
      sampling_manager::thrift::operator<<(out,&response->strategyType);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1b0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::make_shared<jaegertracing::samplers::RateLimitingSampler,short_const&>((short *)&oss);
    std::__shared_ptr<jaegertracing::samplers::Sampler,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<jaegertracing::samplers::Sampler,(__gnu_cxx::_Lock_policy)2> *)&sampler
               ,(__shared_ptr<jaegertracing::samplers::RateLimitingSampler,_(__gnu_cxx::_Lock_policy)2>
                 *)&oss);
  }
  else {
    std::make_shared<jaegertracing::samplers::ProbabilisticSampler,double_const&>((double *)&oss);
    std::__shared_ptr<jaegertracing::samplers::Sampler,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<jaegertracing::samplers::Sampler,(__gnu_cxx::_Lock_policy)2> *)&sampler
               ,(__shared_ptr<jaegertracing::samplers::ProbabilisticSampler,_(__gnu_cxx::_Lock_policy)2>
                 *)&oss);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_188);
  std::__shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_sampler).
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>,
             &sampler.
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sampler.
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void RemotelyControlledSampler::updateRateLimitingOrProbabilisticSampler(
    const SamplingStrategyResponse& response)
{
    std::shared_ptr<Sampler> sampler;
    if (response.__isset.probabilisticSampling) {
        sampler = std::make_shared<ProbabilisticSampler>(
            response.probabilisticSampling.samplingRate);
    }
    else if (response.__isset.rateLimitingSampling) {
        sampler = std::make_shared<RateLimitingSampler>(
            response.rateLimitingSampling.maxTracesPerSecond);
    }
    else {
        std::ostringstream oss;
        oss << "Unsupported sampling strategy type " << response.strategyType;
        throw std::runtime_error(oss.str());
    }
    _sampler = sampler;
}